

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_suite.cpp
# Opt level: O0

void sum_array_string(void)

{
  back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  bVar1;
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar2;
  char *pcVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  basic_variable<std::allocator<char>_> *local_a60;
  basic_variable<std::allocator<char>_> *local_a38;
  basic_variable<std::allocator<char>_> *local_a18;
  basic_variable<std::allocator<char>_> *local_9f0;
  basic_variable<std::allocator<char>_> *local_9d0;
  basic_variable<std::allocator<char>_> *local_9a8;
  basic_variable<std::allocator<char>_> *local_988;
  basic_variable<std::allocator<char>_> *local_960;
  iterator local_950;
  iterator local_938;
  basic_variable<std::allocator<char>_> *local_920;
  basic_variable<std::allocator<char>_> *local_918;
  basic_variable<std::allocator<char>_> *local_910;
  basic_variable<std::allocator<char>_> local_908;
  basic_variable<std::allocator<char>_> local_8d8;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 local_878 [24];
  variable expect_3;
  iterator local_828;
  iterator local_810;
  undefined1 local_7f8 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_3;
  basic_variable<std::allocator<char>_> local_7d8;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  undefined1 local_748 [24];
  variable data_3;
  iterator local_700;
  iterator local_6e8;
  basic_variable<std::allocator<char>_> *local_6d0;
  basic_variable<std::allocator<char>_> *local_6c8;
  basic_variable<std::allocator<char>_> *local_6c0;
  basic_variable<std::allocator<char>_> local_6b8;
  basic_variable<std::allocator<char>_> local_688;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_628 [24];
  variable expect_2;
  iterator local_5d8;
  iterator local_5c0;
  undefined1 local_5a8 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_2;
  basic_variable<std::allocator<char>_> local_588;
  basic_variable<std::allocator<char>_> local_558;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 local_4f8 [24];
  variable data_2;
  iterator local_4b0;
  iterator local_498;
  basic_variable<std::allocator<char>_> *local_480;
  basic_variable<std::allocator<char>_> *local_478;
  basic_variable<std::allocator<char>_> *local_470;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  basic_variable<std::allocator<char>_> local_408;
  undefined1 local_3d8 [24];
  variable expect_1;
  iterator local_388;
  iterator local_370;
  undefined1 local_358 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result_1;
  basic_variable<std::allocator<char>_> local_338;
  basic_variable<std::allocator<char>_> local_308;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_2a8 [24];
  variable data_1;
  iterator local_260;
  iterator local_248;
  basic_variable<std::allocator<char>_> *local_230;
  basic_variable<std::allocator<char>_> *local_228;
  basic_variable<std::allocator<char>_> *local_220;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  basic_variable<std::allocator<char>_> local_1b8;
  undefined1 local_188 [24];
  variable expect;
  iterator local_138;
  iterator local_120;
  undefined1 local_108 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"one");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,"two");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"three");
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar2 = &local_d8;
  local_960 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_960 = local_960 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_960);
  } while (local_960 != pbVar2);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_108);
  expect.storage._40_8_ =
       std::
       partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_120,&local_138,bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  local_220 = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,"one");
  local_220 = &local_1e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,"onetwo");
  local_220 = &local_1b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,"onetwothree");
  local_188._0_8_ = &local_218;
  local_188._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10),
             (basic_array<std::allocator<char>_> *)local_188._0_8_,init_00);
  local_988 = (basic_variable<std::allocator<char>_> *)local_188;
  do {
    local_988 = local_988 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_988);
  } while (local_988 != &local_218);
  local_228 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_108);
  local_230 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_248,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  pcVar3 = "void sum_array_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0x9c,"void sum_array_string()",local_228,local_230,&local_248,&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  result_1.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_338;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_1.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"one");
  result_1.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_308;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_1.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"two");
  result_1.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_1.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"three");
  local_2a8._0_8_ = &local_338;
  local_2a8._8_8_ = 3;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2a8._0_8_,init_01);
  pbVar2 = &local_338;
  local_9a8 = (basic_variable<std::allocator<char>_> *)local_2a8;
  do {
    local_9a8 = local_9a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a8);
  } while (local_9a8 != pbVar2);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_370,(basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_388,(basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  bVar1 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_358);
  expect_1.storage._40_8_ =
       std::
       partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_370,&local_388,bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  local_470 = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_470,L"one");
  local_470 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_470,L"onetwo");
  local_470 = &local_408;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_470,L"onetwothree");
  local_3d8._0_8_ = &local_468;
  local_3d8._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_3d8._0_8_,init_02);
  local_9d0 = (basic_variable<std::allocator<char>_> *)local_3d8;
  do {
    local_9d0 = local_9d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9d0);
  } while (local_9d0 != &local_468);
  local_478 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_358);
  local_480 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_498,(basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4b0,(basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  pcVar3 = "void sum_array_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0xa5,"void sum_array_string()",local_478,local_480,&local_498,&local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3d8 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
  result_2.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_588;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_2.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"one");
  result_2.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_558;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_2.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"two");
  result_2.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_2.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"three");
  local_4f8._0_8_ = &local_588;
  local_4f8._8_8_ = 3;
  init_03._M_len = (size_type)pcVar3;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4f8._0_8_,init_03);
  pbVar2 = &local_588;
  local_9f0 = (basic_variable<std::allocator<char>_> *)local_4f8;
  do {
    local_9f0 = local_9f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9f0);
  } while (local_9f0 != pbVar2);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_5a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5c0,(basic_variable<std::allocator<char>_> *)(local_4f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d8,(basic_variable<std::allocator<char>_> *)(local_4f8 + 0x10));
  bVar1 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_5a8);
  expect_2.storage._40_8_ =
       std::
       partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_5c0,&local_5d8,bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5c0);
  local_6c0 = &local_6b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_6c0,L"one");
  local_6c0 = &local_688;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_6c0,L"onetwo");
  local_6c0 = &local_658;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_6c0,L"onetwothree");
  local_628._0_8_ = &local_6b8;
  local_628._8_8_ = 3;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_628 + 0x10),
             (basic_array<std::allocator<char>_> *)local_628._0_8_,init_04);
  local_a18 = (basic_variable<std::allocator<char>_> *)local_628;
  do {
    local_a18 = local_a18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a18);
  } while (local_a18 != &local_6b8);
  local_6c8 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_5a8);
  local_6d0 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_5a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6e8,(basic_variable<std::allocator<char>_> *)(local_628 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_700,(basic_variable<std::allocator<char>_> *)(local_628 + 0x10));
  pcVar3 = "void sum_array_string()";
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0xae,"void sum_array_string()",local_6c8,local_6d0,&local_6e8,&local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_628 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_5a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4f8 + 0x10));
  result_3.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_7d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_3.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"one");
  result_3.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_7a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_3.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"two");
  result_3.
  super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (result_3.
             super__Vector_base<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,L"three");
  local_748._0_8_ = &local_7d8;
  local_748._8_8_ = 3;
  init_05._M_len = (size_type)pcVar3;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
             (basic_array<std::allocator<char>_> *)local_748._0_8_,init_05);
  pbVar2 = &local_7d8;
  local_a38 = (basic_variable<std::allocator<char>_> *)local_748;
  do {
    local_a38 = local_a38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a38);
  } while (local_a38 != pbVar2);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_810,(basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_828,(basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  bVar1 = std::
          back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                    ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)local_7f8);
  expect_3.storage._40_8_ =
       std::
       partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_810,&local_828,bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_810);
  local_910 = &local_908;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"one");
  local_910 = &local_8d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"onetwo");
  local_910 = &local_8a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_910,L"onetwothree");
  local_878._0_8_ = &local_908;
  local_878._8_8_ = 3;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_878 + 0x10),
             (basic_array<std::allocator<char>_> *)local_878._0_8_,init_06);
  local_a60 = (basic_variable<std::allocator<char>_> *)local_878;
  do {
    local_a60 = local_a60 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a60);
  } while (local_a60 != &local_908);
  local_918 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_7f8);
  local_920 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_938,(basic_variable<std::allocator<char>_> *)(local_878 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_950,(basic_variable<std::allocator<char>_> *)(local_878 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0xb7,"void sum_array_string()",local_918,local_920,&local_938,&local_950);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_950);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_878 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  return;
}

Assistant:

void sum_array_string()
{
    {
        variable data = array::make({ "one", "two", "three" });
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ "one", "onetwo", "onetwothree" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data = array::make({ L"one", L"two", L"three" });
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ L"one", L"onetwo", L"onetwothree" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data = array::make({ u"one", u"two", u"three" });
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ u"one", u"onetwo", u"onetwothree" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data = array::make({ U"one", U"two", U"three" });
        std::vector<variable> result;
        std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
        variable expect = array::make({ U"one", U"onetwo", U"onetwothree" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}